

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::RegisterTraceWriterResponse::~RegisterTraceWriterResponse
          (RegisterTraceWriterResponse *this)

{
  RegisterTraceWriterResponse *this_local;
  
  ~RegisterTraceWriterResponse(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

RegisterTraceWriterResponse::~RegisterTraceWriterResponse() = default;